

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicslayoutitem.cpp
# Opt level: O1

void __thiscall
QGraphicsLayoutItemPrivate::setSizeComponent
          (QGraphicsLayoutItemPrivate *this,SizeHint which,SizeComponent component,qreal value)

{
  undefined8 *puVar1;
  double dVar2;
  QGraphicsLayoutItem *pQVar3;
  QSizeF *pQVar4;
  long lVar5;
  
  pQVar3 = this->q_ptr;
  if (this->userSizeHints == (QSizeF *)0x0) {
    pQVar4 = (QSizeF *)operator_new__(0x40);
    lVar5 = 0;
    do {
      puVar1 = (undefined8 *)((long)&pQVar4[1].wd + lVar5);
      *puVar1 = 0xbff0000000000000;
      puVar1[1] = 0xbff0000000000000;
      puVar1 = (undefined8 *)((long)&pQVar4->wd + lVar5);
      *puVar1 = 0xbff0000000000000;
      puVar1[1] = 0xbff0000000000000;
      lVar5 = lVar5 + 0x20;
    } while (lVar5 != 0x40);
    this->userSizeHints = pQVar4;
  }
  pQVar4 = (QSizeF *)&this->userSizeHints->ht;
  if (component == Width) {
    pQVar4 = this->userSizeHints;
  }
  dVar2 = pQVar4[which].wd;
  if ((dVar2 == value) && (!NAN(dVar2) && !NAN(value))) {
    return;
  }
  pQVar4[which].wd = value;
  (*pQVar3->_vptr_QGraphicsLayoutItem[4])(pQVar3);
  return;
}

Assistant:

void QGraphicsLayoutItemPrivate::setSizeComponent(
    Qt::SizeHint which, SizeComponent component, qreal value)
{
    Q_Q(QGraphicsLayoutItem);
    ensureUserSizeHints();
    qreal &userValue = (component == Width)
        ? userSizeHints[which].rwidth()
        : userSizeHints[which].rheight();
    if (value == userValue)
        return;
    userValue = value;
    q->updateGeometry();
}